

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtCompoundShape * __thiscall
cbtCollisionWorldImporter::createCompoundShape(cbtCollisionWorldImporter *this)

{
  cbtCollisionShape **ptr;
  uint uVar1;
  cbtCompoundShape *this_00;
  cbtCollisionShape **ppcVar2;
  ulong uVar3;
  int iVar4;
  
  this_00 = (cbtCompoundShape *)cbtAlignedAllocInternal(0x80,0x10);
  cbtCompoundShape::cbtCompoundShape(this_00,true,0);
  uVar1 = (this->m_allocatedCollisionShapes).m_size;
  if (uVar1 == (this->m_allocatedCollisionShapes).m_capacity) {
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar4) {
      if (iVar4 == 0) {
        ppcVar2 = (cbtCollisionShape **)0x0;
      }
      else {
        ppcVar2 = (cbtCollisionShape **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
        uVar1 = (this->m_allocatedCollisionShapes).m_size;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          ppcVar2[uVar3] = (this->m_allocatedCollisionShapes).m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      ptr = (this->m_allocatedCollisionShapes).m_data;
      if ((ptr != (cbtCollisionShape **)0x0) &&
         ((this->m_allocatedCollisionShapes).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
        uVar1 = (this->m_allocatedCollisionShapes).m_size;
      }
      (this->m_allocatedCollisionShapes).m_ownsMemory = true;
      (this->m_allocatedCollisionShapes).m_data = ppcVar2;
      (this->m_allocatedCollisionShapes).m_capacity = iVar4;
    }
  }
  (this->m_allocatedCollisionShapes).m_data[(int)uVar1] = (cbtCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = uVar1 + 1;
  return this_00;
}

Assistant:

cbtCompoundShape* cbtCollisionWorldImporter::createCompoundShape()
{
	cbtCompoundShape* shape = new cbtCompoundShape();
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}